

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

void gray_record_cell(gray_PWorker worker)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  PCell_conflict pTVar4;
  TCoord x;
  PCell_conflict cell;
  PCell_conflict *pcell;
  gray_PWorker worker_local;
  
  iVar1 = worker->ex;
  cell = (PCell_conflict)(worker->ycells + (worker->ey - worker->min_ey));
  while ((piVar2 = *(int **)cell, piVar2 != (int *)0x0 && (*piVar2 <= iVar1))) {
    if (*piVar2 == iVar1) {
      piVar2[2] = worker->area + piVar2[2];
      piVar2[1] = worker->cover + piVar2[1];
      return;
    }
    cell = (PCell_conflict)(piVar2 + 4);
  }
  if (worker->num_cells < worker->max_cells) {
    lVar3 = worker->num_cells;
    worker->num_cells = lVar3 + 1;
    pTVar4 = worker->cells + lVar3;
    pTVar4->x = iVar1;
    pTVar4->area = worker->area;
    pTVar4->cover = worker->cover;
    pTVar4->next = *(PCell *)cell;
    *(PCell_conflict *)cell = pTVar4;
    return;
  }
  longjmp((__jmp_buf_tag *)worker,1);
}

Assistant:

static void
  gray_record_cell( RAS_ARG )
  {
    PCell  *pcell, cell;
    TCoord  x = ras.ex;


    pcell = &ras.ycells[ras.ey - ras.min_ey];
    for (;;)
    {
      cell = *pcell;
      if ( !cell || cell->x > x )
        break;

      if ( cell->x == x )
        goto Found;

      pcell = &cell->next;
    }

    if ( ras.num_cells >= ras.max_cells )
      ft_longjmp( ras.jump_buffer, 1 );

    /* insert new cell */
    cell        = ras.cells + ras.num_cells++;
    cell->x     = x;
    cell->area  = ras.area;
    cell->cover = ras.cover;

    cell->next  = *pcell;
    *pcell      = cell;

    return;

  Found:
    /* update old cell */
    cell->area  += ras.area;
    cell->cover += ras.cover;
  }